

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O2

UnlocalizedNumberFormatter *
icu_63::number::impl::NumberPropertyMapper::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,UErrorCode *status)

{
  MacroProps local_3b0;
  MacroProps local_1f0;
  
  NumberFormatter::with();
  oldToNew(&local_3b0,properties,symbols,warehouse,(DecimalFormatProperties *)0x0,status);
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,
             (NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *)&local_1f0,
             &local_3b0);
  MacroProps::~MacroProps(&local_3b0);
  MacroProps::~MacroProps(&local_1f0);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter NumberPropertyMapper::create(const DecimalFormatProperties& properties,
                                                        const DecimalFormatSymbols& symbols,
                                                        DecimalFormatWarehouse& warehouse,
                                                        UErrorCode& status) {
    return NumberFormatter::with().macros(oldToNew(properties, symbols, warehouse, nullptr, status));
}